

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O3

bool __thiscall dg::debug::LLVMDG2Dot::checkNode(LLVMDG2Dot *this,ostream *os,LLVMNode *node)

{
  Value *pVVar1;
  bool bVar2;
  raw_os_ostream ross;
  code *local_68;
  undefined4 local_60;
  long local_58;
  undefined8 uStack_50;
  long local_48;
  undefined1 local_40;
  undefined8 local_38;
  undefined4 local_30;
  ostream *local_28;
  
  pVVar1 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
  if (pVVar1 == (Value *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\nERR: no value in node",0x17);
    bVar2 = true;
  }
  else {
    if ((node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).basicBlock ==
        (BBlock<dg::LLVMNode> *)0x0) {
      bVar2 = false;
      if ((pVVar1[0x10] != (Value)0x0) && (bVar2 = false, pVVar1[0x10] != (Value)0x3)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\\nERR: no BB",0xc);
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if ((0x1a < (byte)pVVar1[0x10]) && (*(long *)(pVVar1 + 0x30) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\" labelURL=\"",0xc);
      local_60 = 0;
      local_40 = 0;
      local_38 = 0;
      local_30 = 1;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      local_68 = std::__cxx11::stringbuf::str;
      local_28 = os;
      llvm::DebugLoc::print((raw_ostream *)(pVVar1 + 0x30));
      if (local_48 != local_58) {
        llvm::raw_ostream::flush_nonempty();
      }
      llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_68);
    }
  }
  return bVar2;
}

Assistant:

bool checkNode(std::ostream &os, LLVMNode *node) override {
        bool err = false;
        const llvm::Value *val = node->getKey();

        if (!val) {
            os << "\\nERR: no value in node";
            return true;
        }

        if (!node->getBBlock() && !llvm::isa<llvm::Function>(val) &&
            !llvm::isa<llvm::GlobalVariable>(val)) {
            err = true;
            os << "\\nERR: no BB";
        }

        // Print Location in source file. Print it only for LLVM 3.6 and higher.
        // The versions before 3.6 had different API, so this is quite
        // a workaround, not a real fix. If anybody needs this functionality
        // on those versions, fix this :)
        if (const llvm::Instruction *I =
                    llvm::dyn_cast<llvm::Instruction>(val)) {
            const llvm::DebugLoc &Loc = I->getDebugLoc();
#if ((LLVM_VERSION_MAJOR > 3) ||                                               \
     ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR > 6)))
            if (Loc) {
                os << "\" labelURL=\"";
                llvm::raw_os_ostream ross(os);
                Loc.print(ross);
#else
            if (Loc.getLine() > 0) {
                os << "\" labelURL=\"";
                llvm::raw_os_ostream ross(os);
                // Loc.print(I->getParent()->getContext(), ross);
                const llvm::DebugLoc *tmpLoc = &Loc;
                int nclosingBrack = 0;
                while (tmpLoc) {
                    llvm::DIScope Scope(
                            tmpLoc->getScope(I->getParent()->getContext()));
                    ross << Scope.getFilename();
                    ross << ':' << tmpLoc->getLine();
                    if (tmpLoc->getCol() != 0)
                        ross << ':' << tmpLoc->getCol();

                    llvm::MDNode *inlineMN =
                            tmpLoc->getInlinedAt(I->getParent()->getContext());
                    if (inlineMN) {
                        llvm::DebugLoc InlinedAtDL =
                                llvm::DebugLoc::getFromDILocation(inlineMN);
                        if (!InlinedAtDL.isUnknown()) {
                            ross << " @[ ";
                            tmpLoc = &InlinedAtDL;
                            nclosingBrack++;
                        } else {
                            tmpLoc = nullptr;
                        }
                    } else {
                        tmpLoc = nullptr;
                    }
                }
                while (nclosingBrack > 0) {
                    ross << " ]";
                    nclosingBrack--;
                }
#endif
                ross.flush();
            }
        }

        return err;
    }

    bool dump(const char *new_file = nullptr,
              const char *dump_func_only = nullptr) override {
        // make sure we have the file opened
        if (!ensureFile(new_file))
            return false;

        const std::map<llvm::Value *, LLVMDependenceGraph *> &CF =
                getConstructedFunctions();

        start();

        for (const auto &F : CF) {
            if (dump_func_only && !F.first->getName().equals(dump_func_only))
                continue;

            dumpSubgraph(F.second, F.first->getName().data());
        }

        end();

        return true;
    }

  private:
    void dumpSubgraph(LLVMDependenceGraph *graph, const char *name) {
        dumpSubgraphStart(graph, name);

        for (auto &B : graph->getBlocks()) {
            dumpBBlock(B.second);
        }

        for (auto &B : graph->getBlocks()) {
            dumpBBlockEdges(B.second);
        }

        dumpSubgraphEnd(graph);
    }
}